

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O1

string * httplib::detail::params_to_query_str(string *__return_storage_ptr__,Params *params)

{
  _Rb_tree_node_base *p_Var1;
  string local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  local_38 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_38;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  for (p_Var1 = (params->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(params->_M_t)._M_impl.super__Rb_tree_header;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    if (p_Var1 != (params->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,*(ulong *)(p_Var1 + 1));
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    encode_query_param(&local_58,(string *)(p_Var1 + 2));
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_58._M_dataplus._M_p)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string params_to_query_str(const Params& params) {
            std::string query;

            for (auto it = params.begin(); it != params.end(); ++it) {
                if (it != params.begin()) { query += "&"; }
                query += it->first;
                query += "=";
                query += encode_query_param(it->second);
            }
            return query;
        }